

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5278::ktxStreamTest_CanCreateKtx2FromCppStream_Test::
~ktxStreamTest_CanCreateKtx2FromCppStream_Test(ktxStreamTest_CanCreateKtx2FromCppStream_Test *this)

{
  ktxStreamTest::~ktxStreamTest(&this->super_ktxStreamTest);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateKtx2FromCppStream)
{
    StreambufStream ktx2Stream{std::move(_ktx2Streambuf), std::ios::in};
    KtxTexture<ktxTexture2> texture2;

    KTX_error_code err = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture2.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create KTX2 from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture2, nullptr) << "Newly-created KTX2 is null";
    EXPECT_TRUE(ktx2Stream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}